

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int verify_opts(nt_opts *opts,char *prog)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *__format;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar2 = 1;
  uVar6 = 1;
  if (opts->check_hdr == 0) {
    uVar6 = (uint)(opts->check_nim != 0);
  }
  if (opts->diff_hdr == 0) {
    uVar2 = (uint)(opts->diff_nim != 0);
  }
  uVar8 = 1;
  uVar7 = 1;
  if (((opts->disp_hdr == 0) && (opts->disp_nim == 0)) && (opts->disp_ana == 0)) {
    uVar7 = (uint)(opts->disp_exts != 0);
  }
  iVar5 = opts->mod_hdr;
  if (iVar5 == 0) {
    uVar8 = (uint)(opts->mod_nim != 0);
  }
  uVar10 = 1;
  uVar9 = 1;
  if ((opts->swap_hdr == 0) && (opts->swap_ana == 0)) {
    uVar9 = (uint)(opts->swap_old != 0);
  }
  iVar1 = opts->add_exts;
  if (iVar1 == 0) {
    uVar10 = (uint)(opts->rm_exts != 0);
  }
  iVar3 = ((((uVar2 + uVar6 + uVar7 + uVar8 + uVar9 + uVar10) - (uint)(opts->strip == 0)) -
           (uint)(opts->cbl == 0)) + 3) - (uint)(opts->cci == 0);
  uVar2 = 1;
  if (opts->dts == 0) {
    uVar2 = (uint)(opts->dci != 0);
  }
  iVar4 = iVar3 + uVar2;
  if (iVar4 == 0 || SCARRY4(iVar3,uVar2) != iVar4 < 0) {
    __format = 
    "** no action option, so nothing to do...\n   (try one of \'-add...\', \'-diff...\', \'-disp...\' or \'-mod...\')\n   (see \'%s -help\' for details)\n"
    ;
LAB_00107e4c:
    fprintf(_stderr,__format,prog);
    return 1;
  }
  if (iVar4 != 1) {
    __format = 
    "** only one action option is allowed, please use only one of:\n        \'-add_...\', \'-check_...\', \'-diff_...\', \'-disp_...\',\n        \'-mod_...\', \'-strip\', \'-dts\', \'-cbl\' or \'-cci\'\n   (see \'%s -help\' for details)\n"
    ;
    goto LAB_00107e4c;
  }
  if ((iVar5 != 0) && (opts->mod_nim != 0)) {
    verify_opts_cold_1();
    return 1;
  }
  if (iVar1 == 0) {
LAB_00107d24:
    if (opts->rm_exts != 0) goto LAB_00107d2a;
  }
  else {
    if (opts->rm_exts != 0) {
      verify_opts_cold_2();
      return 1;
    }
    if (iVar1 == 0) goto LAB_00107d24;
LAB_00107d2a:
    if ((opts->elist).len < 1) {
      verify_opts_cold_3();
      return 1;
    }
  }
  if ((iVar5 != 0) || (opts->mod_nim != 0)) {
    iVar1 = (opts->flist).len;
    if (iVar1 < 1) {
      verify_opts_cold_8();
      return 1;
    }
    if (iVar1 != (opts->vlist).len) {
      fprintf(_stderr,"** error: modifying %d fields with %d values\n");
      return 1;
    }
  }
  if ((opts->diff_hdr == 0) && (opts->diff_nim == 0)) {
    if ((((iVar5 != 0) || (0 < (opts->elist).len)) || (opts->swap_hdr != 0 || opts->mod_nim != 0))
       || ((opts->swap_ana != 0 || (opts->swap_old != 0)))) {
      iVar5 = 0;
      if (opts->overwrite == 0) {
        if ((opts->infiles).len < 2) {
          iVar5 = 0;
          if (opts->prefix != (char *)0x0) goto LAB_00107d76;
          verify_opts_cold_5();
        }
        else {
          verify_opts_cold_6();
        }
        iVar5 = 1;
      }
      goto LAB_00107d76;
    }
  }
  else if ((opts->infiles).len != 2) {
    verify_opts_cold_4();
    return 1;
  }
  iVar5 = 0;
LAB_00107d76:
  if (((opts->dci_lines != 0) && (opts->dts == 0)) && (opts->dci == 0)) {
    fwrite("** option \'-dci_lines\' must only be used with \'-dts\'\n",0x35,1,_stderr);
    iVar5 = iVar5 + 1;
  }
  if ((opts->infiles).len < 1) {
    fwrite("** missing input files (see -infiles option)\n",0x2d,1,_stderr);
    iVar5 = iVar5 + 1;
  }
  if ((opts->overwrite != 0) && (opts->prefix != (char *)0x0)) {
    fwrite("** please specify only one of -prefix and -overwrite\n",0x35,1,_stderr);
    iVar5 = iVar5 + 1;
  }
  if (iVar5 == 0) {
    if (1 < g_debug) {
      verify_opts_cold_7();
      return 0;
    }
    return 0;
  }
  return 1;
}

Assistant:

int verify_opts( nt_opts * opts, char * prog )
{
   int ac, errs = 0;   /* number of requested action types */

   /* check that only one of disp, diff, mod or add_*_ext is used */
   ac  = (opts->check_hdr || opts->check_nim                   ) ? 1 : 0;
   ac += (opts->diff_hdr  || opts->diff_nim                    ) ? 1 : 0;
   ac += (opts->disp_hdr  || opts->disp_nim  ||
          opts->disp_ana  || opts->disp_exts                   ) ? 1 : 0;
   ac += (opts->mod_hdr   || opts->mod_nim                     ) ? 1 : 0;
   ac += (opts->swap_hdr  || opts->swap_ana  || opts->swap_old ) ? 1 : 0;
   ac += (opts->add_exts  || opts->rm_exts                     ) ? 1 : 0;
   ac += (opts->strip                                          ) ? 1 : 0;
   ac += (opts->cbl                                            ) ? 1 : 0;
   ac += (opts->cci                                            ) ? 1 : 0;
   ac += (opts->dts       || opts->dci                         ) ? 1 : 0;

   if( ac < 1 )
   {
      fprintf(stderr,
              "** no action option, so nothing to do...\n"
              "   (try one of '-add...', '-diff...', '-disp...' or '-mod...')\n"
              "   (see '%s -help' for details)\n", prog);
      return 1;
   }
   else if( ac > 1 )
   {
      fprintf(stderr,
         "** only one action option is allowed, please use only one of:\n"
         "        '-add_...', '-check_...', '-diff_...', '-disp_...',\n"
         "        '-mod_...', '-strip', '-dts', '-cbl' or '-cci'\n"
         "   (see '%s -help' for details)\n", prog);
      return 1;
   }

   /* can modify nifti_1_header or nifti_image, but not both */
   if( opts->mod_hdr && opts->mod_nim )
   {
      fprintf(stderr,"** cannot use both '-mod_hdr' and '-mod_nim'\n");
      return 1;
   }

   /* can add or remove extensions, but not both */
   if( opts->add_exts && opts->rm_exts )
   {
      fprintf(stderr,"** cannot use both '-add_*_ext' and '-rm_ext'\n");
      return 1;
   }
   if( (opts->add_exts || opts->rm_exts) && opts->elist.len <= 0 )
   {
      fprintf(stderr,"** missing extensions to add or remove\n");
      return 1;
   }

   /* if modify, then we need fields and corresponding values */
   if( opts->mod_hdr || opts->mod_nim )
   {
      if( opts->flist.len <= 0 )
      {
         fprintf(stderr,"** missing field to modify (need '-mod_field' opt)\n");
         return 1;
      }
      if( opts->flist.len != opts->vlist.len )
      {
         fprintf(stderr,"** error: modifying %d fields with %d values\n",
                 opts->flist.len, opts->vlist.len);
         return 1;
      }
   }

   /* verify the number of files given for each of 4 action types */

   /* -diff_... : require nfiles == 2 */
   if( opts->diff_hdr || opts->diff_nim )
   {
     if( opts->infiles.len != 2 )
     {
      fprintf(stderr,"** '-diff_XXX' options require exactly 2 inputs files\n");
      return 1;
     }
   }
   /* if we are making changes, but not overwriting... */
   else if( (opts->elist.len > 0 || opts->mod_hdr || opts->mod_nim ||
             opts->swap_hdr || opts->swap_ana || opts->swap_old ) &&
            !opts->overwrite )
   {
      if( opts->infiles.len > 1 )
      {
         fprintf(stderr,"** without -overwrite, only one input file may be"
                          " modified at a time\n");
         errs++;
      }
      else if( ! opts->prefix )
      {
         fprintf(stderr,"** missing -prefix for output file\n");
         errs++;
      }
   }

   if( opts->dci_lines && ! opts->dts && ! opts->dci )
   {
      fprintf(stderr,"** option '-dci_lines' must only be used with '-dts'\n");
      errs++;
   }

   if( opts->infiles.len <= 0 ) /* in any case */
   {
      fprintf(stderr,"** missing input files (see -infiles option)\n");
      errs++;
   }

   if ( opts->overwrite && opts->prefix )
   {
      fprintf(stderr, "** please specify only one of -prefix and -overwrite\n");
      errs++;
   }

   if( errs ) return 1;

   if( g_debug > 1 ) fprintf(stderr,"+d options seem valid\n");

   return 0;
}